

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

int IsNanOrInfDouble(double value)

{
  EpType val;
  double value_local;
  
  if ((((((uint)((ulong)value >> 0x34) & 0x7ff) == 0x7ff) && (((ulong)value >> 0x20 & 0x7ffff) == 0)
       ) && (SUB84(value,0) == 0)) && (((long)value < 0 || (((ulong)value >> 0x33 & 1) == 0)))) {
    value_local._4_4_ = 1;
  }
  else {
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

int
IsNanOrInfDouble(double value)
{
  EpType        val;

  val.value = value;
  if (val.nan.exponent == EPD_EXP_INF &&
      val.nan.mantissa0 == 0 &&
      val.nan.mantissa1 == 0 &&
      (val.nan.sign == 1 || val.nan.quiet_bit == 0)) {
    return(1);
  }
  return(0);
}